

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

void __thiscall
helics::BrokerApp::BrokerApp
          (BrokerApp *this,CoreType ctype,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  _Alloc_hider in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffc8);
  BrokerApp((BrokerApp *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
            in_stack_ffffffffffffffd0,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffffc8._M_p);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype, std::vector<std::string>&& args):
    BrokerApp(ctype, std::string{}, std::move(args))
{
}